

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

string * __thiscall
VectorInstance::op_firstIndexOf
          (string *__return_storage_ptr__,VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  bool bVar1;
  undefined8 *puVar2;
  InstanceIsEqualToComparator *this_00;
  pointer lhs;
  long lVar3;
  shared_ptr<Instance> instance;
  undefined1 auStack_98 [112];
  
  this_00 = (InstanceIsEqualToComparator *)auStack_98;
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start != 0x20) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  get_shared_instance((string *)auStack_98,&this->_element_type);
  lhs = (this->_value).
        super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>.
        _M_impl.super__Vector_impl_data._M_start;
  if (lhs != (this->_value).
             super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
    lVar3 = -(long)lhs;
    do {
      bVar1 = InstanceIsEqualToComparator::operator()
                        (this_00,lhs,(shared_ptr<Instance> *)auStack_98);
      if (bVar1) {
        IntegerInstance::IntegerInstance
                  ((IntegerInstance *)(auStack_98 + 0x10),
                   (int)((ulong)-((long)&(((this->_value).
                                           super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>).
                                         _M_ptr + lVar3) >> 4));
        IntegerInstance::representation_abi_cxx11_
                  (__return_storage_ptr__,(IntegerInstance *)(auStack_98 + 0x10));
        CharacterInstance::~CharacterInstance((CharacterInstance *)(auStack_98 + 0x10));
        goto LAB_00149c32;
      }
      lhs = lhs + 1;
      lVar3 = lVar3 + -0x10;
    } while (lhs != (this->_value).
                    super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"-1","");
LAB_00149c32:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_98._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_98._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VectorInstance::op_firstIndexOf(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> instance = get_shared_instance(_element_type, arguments[0]);
    for (auto it = _value.begin(); it != _value.end(); it++)
        if (InstanceIsEqualToComparator()(*it, instance))
            return IntegerInstance(it - _value.begin()).representation();
    return "-1";
}